

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<Fad<double>_>::Decompose_Cholesky(TPZMatrix<Fad<double>_> *this)

{
  bool bVar1;
  int iVar2;
  Fad<double> *this_00;
  Fad<double> *pFVar3;
  undefined4 extraout_var;
  TPZBaseMatrix *in_RDI;
  Fad<double> tmp2;
  Fad<double> sum_1;
  int64_t k_1;
  int64_t j;
  Fad<double> tmp;
  Fad<double> sum;
  int64_t k;
  int64_t i;
  int64_t dim;
  Fad<double> *in_stack_fffffffffffffc90;
  Fad<double> *in_stack_fffffffffffffc98;
  Fad<double> *in_stack_fffffffffffffca0;
  Fad<double> *in_stack_fffffffffffffcb8;
  Fad<double> *in_stack_fffffffffffffcc0;
  Fad<double> *in_stack_fffffffffffffcc8;
  Fad<double> *in_stack_fffffffffffffcd8;
  undefined1 local_310 [32];
  undefined1 local_2f0 [32];
  undefined1 local_2d0 [48];
  undefined1 local_2a0 [64];
  undefined1 local_260 [32];
  undefined1 local_240 [48];
  undefined1 local_210 [32];
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [48];
  undefined8 local_1a0;
  char *in_stack_fffffffffffffe88;
  char *msg2;
  char *in_stack_fffffffffffffe90;
  Fad<double> *pFVar4;
  Fad<double> local_168 [2];
  undefined1 local_120 [32];
  undefined1 local_100 [48];
  undefined1 local_d0 [32];
  undefined1 local_b0 [48];
  undefined1 local_80 [52];
  undefined4 local_4c;
  long local_28;
  Fad<double> *local_20;
  long local_18;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x03')) {
    Error(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  if (in_RDI->fDecomposed == '\0') {
    this_00 = (Fad<double> *)TPZBaseMatrix::Rows(in_RDI);
    pFVar3 = (Fad<double> *)TPZBaseMatrix::Cols(in_RDI);
    if (this_00 != pFVar3) {
      Error(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_18 = CONCAT44(extraout_var,iVar2);
    for (local_20 = (Fad<double> *)0x0; (long)local_20 < local_18;
        local_20 = (Fad<double> *)((long)&local_20->val_ + 1)) {
      for (local_28 = 0; local_28 < (long)local_20; local_28 = local_28 + 1) {
        local_4c = 0;
        Fad<double>::Fad<int,_nullptr>(in_stack_fffffffffffffca0,(int *)in_stack_fffffffffffffc98);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_80,in_RDI,local_20,local_28);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_b0,in_RDI,local_20,local_28);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
        Fad<double>::operator+=
                  (in_stack_fffffffffffffcc0,
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffcb8);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffc90);
        Fad<double>::~Fad(in_stack_fffffffffffffc90);
        Fad<double>::~Fad(in_stack_fffffffffffffc90);
        pFVar3 = local_20;
        in_stack_fffffffffffffcd8 = local_20;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_100,in_RDI,local_20);
        operator-<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
        Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                  (this_00,(FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                           in_stack_fffffffffffffcd8);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_fffffffffffffcd8,pFVar3,local_d0);
        Fad<double>::~Fad(in_stack_fffffffffffffc90);
        FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffc90)
        ;
        Fad<double>::~Fad(in_stack_fffffffffffffc90);
        Fad<double>::~Fad(in_stack_fffffffffffffc90);
      }
      in_stack_fffffffffffffcc8 = local_168;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                (in_stack_fffffffffffffcc8,in_RDI,local_20);
      sqrt<double>(in_stack_fffffffffffffcc8);
      Fad<double>::Fad<FadFuncSqrt<Fad<double>>>
                (this_00,(FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_fffffffffffffcd8);
      FadExpr<FadFuncSqrt<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_fffffffffffffc90);
      Fad<double>::~Fad(in_stack_fffffffffffffc90);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_20,local_20,local_120);
      pFVar3 = local_20;
      while (pFVar3 = (Fad<double> *)((long)&pFVar3->val_ + 1), (long)pFVar3 < local_18) {
        for (msg2 = (char *)0x0; (long)msg2 < (long)local_20; msg2 = msg2 + 1) {
          local_1a0 = 0;
          Fad<double>::Fad<double,_nullptr>
                    (in_stack_fffffffffffffca0,&in_stack_fffffffffffffc98->val_);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_1d0,in_RDI,local_20,msg2);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_1f0,in_RDI,pFVar3,msg2);
          operator*<Fad<double>,_Fad<double>,_nullptr>
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
          Fad<double>::operator+=
                    (in_stack_fffffffffffffcc0,
                     (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffcb8)
          ;
          FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffc90)
          ;
          Fad<double>::~Fad(in_stack_fffffffffffffc90);
          in_stack_fffffffffffffcc0 = pFVar3;
          Fad<double>::~Fad(in_stack_fffffffffffffc90);
          in_stack_fffffffffffffcb8 = local_20;
          pFVar3 = in_stack_fffffffffffffcc0;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_240);
          operator-<Fad<double>,_Fad<double>,_nullptr>
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
          Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                    (this_00,(FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                             in_stack_fffffffffffffcd8);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                    (in_RDI,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcc0,local_210);
          Fad<double>::~Fad(in_stack_fffffffffffffc90);
          FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)
                     in_stack_fffffffffffffc90);
          Fad<double>::~Fad(in_stack_fffffffffffffc90);
          Fad<double>::~Fad(in_stack_fffffffffffffc90);
        }
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_260,in_RDI,local_20);
        Fad<double>::Fad(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
        bVar1 = IsZero<Fad<double>>(in_stack_fffffffffffffc90);
        Fad<double>::~Fad(in_stack_fffffffffffffc90);
        if (bVar1) {
          Error((char *)pFVar3,msg2);
        }
        in_stack_fffffffffffffca0 = local_20;
        pFVar4 = pFVar3;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_2d0);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_2f0,in_RDI,local_20);
        operator/<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
        Fad<double>::Fad<FadBinaryDiv<Fad<double>,Fad<double>>>
                  (this_00,(FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)
                           in_stack_fffffffffffffcd8);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_fffffffffffffca0,pFVar3,local_2a0);
        Fad<double>::~Fad(in_stack_fffffffffffffc90);
        FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffc90);
        Fad<double>::~Fad(in_stack_fffffffffffffc90);
        Fad<double>::~Fad(in_stack_fffffffffffffc90);
        in_stack_fffffffffffffc90 = pFVar4;
        in_stack_fffffffffffffc98 = local_20;
        pFVar3 = in_stack_fffffffffffffc90;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_310);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_fffffffffffffc90,in_stack_fffffffffffffc98,local_310);
        Fad<double>::~Fad(in_stack_fffffffffffffc90);
        Fad<double>::~Fad(in_stack_fffffffffffffc90);
      }
      Fad<double>::~Fad(in_stack_fffffffffffffc90);
    }
    in_RDI->fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}